

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O1

void __thiscall Dialog::prepare(Dialog *this)

{
  ALLEGRO_MOUSE_STATE mst;
  int local_40;
  int local_3c;
  
  configure_all(this);
  al_get_mouse_state(&local_40);
  check_mouse_over(this,local_40,local_3c);
  return;
}

Assistant:

void Dialog::prepare()
{
   this->configure_all();

   /* XXX this isn't working right in X.  The mouse position is reported as
    * (0,0) initially, until the mouse pointer is moved.
    */
   ALLEGRO_MOUSE_STATE mst;
   al_get_mouse_state(&mst);
   this->check_mouse_over(mst.x, mst.y);
}